

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGValidStatePtr
xmlRelaxNGCopyValidState(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGValidStatePtr state)

{
  int iVar1;
  xmlDocPtr pxVar2;
  xmlAttrPtr *tmp;
  xmlAttrPtr *attrs;
  xmlRelaxNGValidCtxtPtr pxStack_28;
  uint maxAttrs;
  xmlRelaxNGValidStatePtr ret;
  xmlRelaxNGValidStatePtr state_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (state == (xmlRelaxNGValidStatePtr)0x0) {
    ctxt_local = (xmlRelaxNGValidCtxtPtr)0x0;
  }
  else {
    if ((ctxt->freeState == (xmlRelaxNGStatesPtr)0x0) || (ctxt->freeState->nbState < 1)) {
      pxStack_28 = (xmlRelaxNGValidCtxtPtr)(*xmlMalloc)(0x38);
      if (pxStack_28 == (xmlRelaxNGValidCtxtPtr)0x0) {
        xmlRngVErrMemory(ctxt);
        return (xmlRelaxNGValidStatePtr)0x0;
      }
      memset(pxStack_28,0,0x38);
    }
    else {
      ctxt->freeState->nbState = ctxt->freeState->nbState + -1;
      pxStack_28 = (xmlRelaxNGValidCtxtPtr)ctxt->freeState->tabState[ctxt->freeState->nbState];
    }
    pxVar2 = pxStack_28->doc;
    iVar1 = *(int *)((long)&pxStack_28->warning + 4);
    memcpy(pxStack_28,state,0x38);
    pxStack_28->doc = pxVar2;
    *(int *)((long)&pxStack_28->warning + 4) = iVar1;
    if (0 < state->nbAttrs) {
      if (pxStack_28->doc == (xmlDocPtr)0x0) {
        *(int *)((long)&pxStack_28->warning + 4) = state->maxAttrs;
        pxVar2 = (xmlDocPtr)(*xmlMalloc)((long)*(int *)((long)&pxStack_28->warning + 4) << 3);
        pxStack_28->doc = pxVar2;
        if (pxStack_28->doc == (xmlDocPtr)0x0) {
          xmlRngVErrMemory(ctxt);
          *(int *)&pxStack_28->warning = 0;
          return (xmlRelaxNGValidStatePtr)pxStack_28;
        }
      }
      else if (*(int *)((long)&pxStack_28->warning + 4) < state->nbAttrs) {
        pxVar2 = (xmlDocPtr)(*xmlRealloc)(pxStack_28->doc,(long)state->maxAttrs << 3);
        if (pxVar2 == (xmlDocPtr)0x0) {
          xmlRngVErrMemory(ctxt);
          *(int *)&pxStack_28->warning = 0;
          return (xmlRelaxNGValidStatePtr)pxStack_28;
        }
        *(int *)((long)&pxStack_28->warning + 4) = state->maxAttrs;
        pxStack_28->doc = pxVar2;
      }
      memcpy(pxStack_28->doc,state->attrs,(long)state->nbAttrs << 3);
    }
    ctxt_local = pxStack_28;
  }
  return (xmlRelaxNGValidStatePtr)ctxt_local;
}

Assistant:

static xmlRelaxNGValidStatePtr
xmlRelaxNGCopyValidState(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGValidStatePtr state)
{
    xmlRelaxNGValidStatePtr ret;
    unsigned int maxAttrs;
    xmlAttrPtr *attrs;

    if (state == NULL)
        return (NULL);
    if ((ctxt->freeState != NULL) && (ctxt->freeState->nbState > 0)) {
        ctxt->freeState->nbState--;
        ret = ctxt->freeState->tabState[ctxt->freeState->nbState];
    } else {
        ret =
            (xmlRelaxNGValidStatePtr)
            xmlMalloc(sizeof(xmlRelaxNGValidState));
        if (ret == NULL) {
            xmlRngVErrMemory(ctxt);
            return (NULL);
        }
        memset(ret, 0, sizeof(xmlRelaxNGValidState));
    }
    attrs = ret->attrs;
    maxAttrs = ret->maxAttrs;
    memcpy(ret, state, sizeof(xmlRelaxNGValidState));
    ret->attrs = attrs;
    ret->maxAttrs = maxAttrs;
    if (state->nbAttrs > 0) {
        if (ret->attrs == NULL) {
            ret->maxAttrs = state->maxAttrs;
            ret->attrs = (xmlAttrPtr *) xmlMalloc(ret->maxAttrs *
                                                  sizeof(xmlAttrPtr));
            if (ret->attrs == NULL) {
                xmlRngVErrMemory(ctxt);
                ret->nbAttrs = 0;
                return (ret);
            }
        } else if (ret->maxAttrs < state->nbAttrs) {
            xmlAttrPtr *tmp;

            tmp = (xmlAttrPtr *) xmlRealloc(ret->attrs, state->maxAttrs *
                                            sizeof(xmlAttrPtr));
            if (tmp == NULL) {
                xmlRngVErrMemory(ctxt);
                ret->nbAttrs = 0;
                return (ret);
            }
            ret->maxAttrs = state->maxAttrs;
            ret->attrs = tmp;
        }
        memcpy(ret->attrs, state->attrs,
               state->nbAttrs * sizeof(xmlAttrPtr));
    }
    return (ret);
}